

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPStateImp.cpp
# Opt level: O2

void __thiscall
TSPStateImp::PrintSolution(TSPStateImp *this,vector<int,_std::allocator<int>_> *state)

{
  ostream *poVar1;
  int *piVar2;
  
  std::operator<<((ostream *)&std::cout,'\t');
  for (piVar2 = (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      piVar2 != (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish; piVar2 = piVar2 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar2);
    std::operator<<(poVar1," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void TSPStateImp::PrintSolution(std::vector<int> *state)
{
	std::cout << '\t';
	for (auto iter = state->begin(); iter != state->end(); ++iter)
		std::cout << *iter << " ";
	std::cout << std::endl;

}